

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ColoredLineCase::ColoredLineCase
          (ColoredLineCase *this,Context *context,char *name,char *description,
          ColoredLineData *linesBegin,ColoredLineData *linesEnd,float lineWidth,
          WindowRectangle *viewport)

{
  undefined8 uVar1;
  ColoredLineData *__cur;
  pointer pCVar2;
  TestContext *testCtx;
  _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  *this_00;
  
  testCtx = context->m_testCtx;
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,"line attribute clipping");
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.m_context = context;
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__LineRenderTestCase_00792c00;
  (this->super_LineRenderTestCase).m_lineWidth = lineWidth;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (_Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
             *)((long)linesBegin - (long)description >> 6);
  if ((ulong)this_00 >> 0x39 == 0) {
    pCVar2 = std::
             _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
             ::_M_allocate(this_00,(size_t)testCtx);
    (this->super_LineRenderTestCase).m_lines.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
    ._M_impl.super__Vector_impl_data._M_start = pCVar2;
    (this->super_LineRenderTestCase).m_lines.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(((long)linesBegin - (long)description) + (long)pCVar2);
    for (; (ColoredLineData *)description != linesBegin;
        description = (char *)((long)description + 0x40)) {
      uVar1 = *(undefined8 *)((((ColoredLineData *)description)->p0).m_data + 2);
      *(undefined8 *)(pCVar2->p0).m_data =
           *(undefined8 *)(((ColoredLineData *)description)->p0).m_data;
      *(undefined8 *)((pCVar2->p0).m_data + 2) = uVar1;
      uVar1 = *(undefined8 *)((((ColoredLineData *)description)->c0).m_data + 2);
      *(undefined8 *)(pCVar2->c0).m_data =
           *(undefined8 *)(((ColoredLineData *)description)->c0).m_data;
      *(undefined8 *)((pCVar2->c0).m_data + 2) = uVar1;
      uVar1 = *(undefined8 *)((((ColoredLineData *)description)->p1).m_data + 2);
      *(undefined8 *)(pCVar2->p1).m_data =
           *(undefined8 *)(((ColoredLineData *)description)->p1).m_data;
      *(undefined8 *)((pCVar2->p1).m_data + 2) = uVar1;
      uVar1 = *(undefined8 *)((((ColoredLineData *)description)->c1).m_data + 2);
      *(undefined8 *)(pCVar2->c1).m_data =
           *(undefined8 *)(((ColoredLineData *)description)->c1).m_data;
      *(undefined8 *)((pCVar2->c1).m_data + 2) = uVar1;
      pCVar2 = pCVar2 + 1;
    }
    (this->super_LineRenderTestCase).m_lines.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar2;
    (this->super_LineRenderTestCase).m_viewport.left = 0;
    (this->super_LineRenderTestCase).m_viewport.bottom = 0;
    (this->super_LineRenderTestCase).m_viewport.width = 200;
    (this->super_LineRenderTestCase).m_viewport.height = 200;
    (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.
    super_TestNode._vptr_TestNode = (_func_int **)&PTR__LineRenderTestCase_00792c48;
    return;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

ColoredLineCase::ColoredLineCase (Context& context, const char* name, const char* description, const LineRenderTestCase::ColoredLineData* linesBegin, const LineRenderTestCase::ColoredLineData* linesEnd, float lineWidth, const rr::WindowRectangle& viewport)
	: LineRenderTestCase (context, name, description, linesBegin, linesEnd, lineWidth, viewport)
{
}